

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O1

_Bool av1_compute_global_motion_feature_match
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  CornerList *corners_00;
  PyramidLayer *pPVar5;
  uchar *puVar6;
  uchar *puVar7;
  _Bool _Var8;
  int iVar9;
  Correspondence *matched_points;
  void *memblk;
  void *memblk_00;
  int iVar10;
  size_t sVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  int iVar18;
  double dVar19;
  ulong local_b0;
  ulong local_98;
  double local_50;
  double u;
  double *local_40;
  MotionModel *local_38;
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  corners_00 = ref->corners;
  local_38 = motion_models;
  iVar9 = aom_compute_pyramid(src,bit_depth,1,pyr);
  if ((((iVar9 < 0) ||
       (_Var8 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), !_Var8)) ||
      (iVar9 = aom_compute_pyramid(ref,bit_depth,1,pyr_00), iVar9 < 0)) ||
     (_Var8 = av1_compute_corner_list(src,bit_depth,downsample_level,corners_00), !_Var8)) {
LAB_0029c241:
    *mem_alloc_failed = true;
    return false;
  }
  pPVar5 = pyr->layers;
  puVar6 = pPVar5->buffer;
  iVar9 = pPVar5->width;
  iVar2 = pPVar5->height;
  iVar3 = pPVar5->stride;
  pPVar5 = pyr_00->layers;
  puVar7 = pPVar5->buffer;
  iVar10 = pPVar5->stride;
  matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5);
  if (matched_points == (Correspondence *)0x0) goto LAB_0029c241;
  iVar18 = corners->num_corners;
  iVar13 = corners_00->num_corners;
  memblk = aom_calloc((long)iVar18,0x28);
  if ((memblk == (void *)0x0) ||
     (memblk_00 = aom_calloc((long)iVar13,0x28), memblk_00 == (void *)0x0)) {
    memblk_00 = (void *)0x0;
  }
  else {
    local_98 = 0;
    if (0 < iVar18) {
      sVar11 = 0;
      local_98 = 0;
      do {
        iVar14 = corners->corners[sVar11 * 2];
        if (((6 < iVar14) && (iVar4 = corners->corners[sVar11 * 2 + 1], 6 < iVar4)) &&
           ((iVar14 + 7 < iVar9 && (iVar4 + 7 < iVar2)))) {
          lVar12 = (long)(int)local_98;
          *(int *)((long)memblk + lVar12 * 0x28) = iVar14;
          *(int *)((long)memblk + lVar12 * 0x28 + 4) = iVar4;
          *(undefined8 *)((long)memblk + lVar12 * 0x28 + 0x20) = 0x3fe8000000000000;
          _Var8 = (*aom_compute_mean_stddev)
                            (puVar6,iVar3,iVar14,iVar4,(double *)((long)memblk + lVar12 * 0x28 + 8),
                             (double *)((long)memblk + lVar12 * 0x28 + 0x10));
          local_98 = (ulong)((int)local_98 + (uint)_Var8);
        }
        sVar11 = sVar11 + 1;
      } while ((long)iVar18 != sVar11);
    }
    if ((int)local_98 != 0) {
      local_b0 = 0;
      if (0 < iVar13) {
        sVar11 = 0;
        local_b0 = 0;
        do {
          iVar18 = corners_00->corners[sVar11 * 2];
          if ((((6 < iVar18) && (iVar14 = corners_00->corners[sVar11 * 2 + 1], 6 < iVar14)) &&
              (iVar18 + 7 < iVar9)) && (iVar14 + 7 < iVar2)) {
            lVar12 = (long)(int)local_b0;
            *(int *)((long)memblk_00 + lVar12 * 0x28) = iVar18;
            *(int *)((long)memblk_00 + lVar12 * 0x28 + 4) = iVar14;
            *(undefined8 *)((long)memblk_00 + lVar12 * 0x28 + 0x20) = 0x3fe8000000000000;
            _Var8 = (*aom_compute_mean_stddev)
                              (puVar7,iVar10,iVar18,iVar14,
                               (double *)((long)memblk_00 + lVar12 * 0x28 + 8),
                               (double *)((long)memblk_00 + lVar12 * 0x28 + 0x10));
            local_b0 = (ulong)((int)local_b0 + (uint)_Var8);
          }
          sVar11 = sVar11 + 1;
        } while ((long)iVar13 != sVar11);
      }
      if (((int)local_b0 == 0) || ((int)local_98 < 1)) {
        iVar10 = 0;
      }
      else {
        iVar18 = iVar2;
        if (iVar2 < iVar9) {
          iVar18 = iVar9;
        }
        local_40 = (double *)((long)memblk_00 + 0x20);
        uVar16 = 0;
        do {
          if (0 < (int)local_b0) {
            piVar1 = (int *)((long)memblk + uVar16 * 0x28);
            uVar15 = 0;
            pdVar17 = local_40;
            do {
              iVar13 = *piVar1 - *(int *)(pdVar17 + -4);
              iVar14 = piVar1[1] - *(int *)((long)pdVar17 + -0x1c);
              if ((uint)(iVar14 * iVar14 + iVar13 * iVar13) <= (uint)((iVar18 >> 4) * (iVar18 >> 4))
                 ) {
                dVar19 = (*aom_compute_correlation)
                                   (puVar6,iVar3,*piVar1,piVar1[1],*(double *)(piVar1 + 2),
                                    *(double *)(piVar1 + 4),puVar7,iVar10,*(int *)(pdVar17 + -4),
                                    *(int *)((long)pdVar17 + -0x1c),pdVar17[-3],pdVar17[-2]);
                if (*(double *)(piVar1 + 8) <= dVar19 && dVar19 != *(double *)(piVar1 + 8)) {
                  piVar1[6] = (int)uVar15;
                  *(double *)(piVar1 + 8) = dVar19;
                }
                if (*pdVar17 <= dVar19 && dVar19 != *pdVar17) {
                  *(int *)(pdVar17 + -1) = (int)uVar16;
                  *pdVar17 = dVar19;
                }
              }
              uVar15 = uVar15 + 1;
              pdVar17 = pdVar17 + 5;
            } while (local_b0 != uVar15);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_98);
        if ((int)local_98 < 1) {
          iVar10 = 0;
        }
        else {
          pdVar17 = (double *)((long)memblk + 0x20);
          uVar16 = 0;
          iVar10 = 0;
          do {
            if ((0.75 < *pdVar17 || *pdVar17 == 0.75) &&
               (uVar16 == *(uint *)((long)memblk_00 + (long)*(int *)(pdVar17 + -1) * 0x28 + 0x18)))
            {
              piVar1 = (int *)((long)memblk_00 + (long)*(int *)(pdVar17 + -1) * 0x28);
              iVar18 = *(int *)(pdVar17 + -4);
              iVar13 = *(int *)((long)pdVar17 + -0x1c);
              u = (double)(*piVar1 - iVar18);
              local_50 = (double)(piVar1[1] - iVar13);
              (*aom_compute_flow_at_point)
                        (puVar6,puVar7,iVar18 + -3,iVar13 + -3,iVar9,iVar2,iVar3,&u,&local_50);
              matched_points[iVar10].x = (double)iVar18;
              matched_points[iVar10].y = (double)iVar13;
              matched_points[iVar10].rx = (double)iVar18 + u;
              matched_points[iVar10].ry = (double)iVar13 + local_50;
              iVar10 = iVar10 + 1;
            }
            uVar16 = uVar16 + 1;
            pdVar17 = pdVar17 + 5;
          } while (local_98 != uVar16);
        }
      }
      goto LAB_0029c276;
    }
  }
  iVar10 = 0;
LAB_0029c276:
  aom_free(memblk);
  aom_free(memblk_00);
  _Var8 = ransac(matched_points,iVar10,type,local_38,num_motion_models,mem_alloc_failed);
  aom_free(matched_points);
  return _Var8;
}

Assistant:

bool av1_compute_global_motion_feature_match(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  int num_correspondences;
  Correspondence *correspondences;
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;
  CornerList *ref_corners = ref->corners;

  // Precompute information we will need about each frame
  if (aom_compute_pyramid(src, bit_depth, 1, src_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }
  if (aom_compute_pyramid(ref, bit_depth, 1, ref_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, ref_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  const uint8_t *src_buffer = src_pyramid->layers[0].buffer;
  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  const int src_stride = src_pyramid->layers[0].stride;

  const uint8_t *ref_buffer = ref_pyramid->layers[0].buffer;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);
  const int ref_stride = ref_pyramid->layers[0].stride;

  // find correspondences between the two images
  correspondences = (Correspondence *)aom_malloc(src_corners->num_corners *
                                                 sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    return false;
  }
  num_correspondences = determine_correspondence(
      src_buffer, src_corners->corners, src_corners->num_corners, ref_buffer,
      ref_corners->corners, ref_corners->num_corners, src_width, src_height,
      src_stride, ref_stride, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  return result;
}